

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_registerArchiver(PHYSFS_Archiver *archiver)

{
  int iVar1;
  
  if (initialized != '\0') {
    __PHYSFS_platformGrabMutex(stateLock);
    iVar1 = doRegisterArchiver(archiver);
    __PHYSFS_platformReleaseMutex(stateLock);
    return iVar1;
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_NOT_INITIALIZED);
  return 0;
}

Assistant:

int PHYSFS_registerArchiver(const PHYSFS_Archiver *archiver)
{
    int retval;
    BAIL_IF(!initialized, PHYSFS_ERR_NOT_INITIALIZED, 0);
    __PHYSFS_platformGrabMutex(stateLock);
    retval = doRegisterArchiver(archiver);
    __PHYSFS_platformReleaseMutex(stateLock);
    return retval;
}